

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChildKiller_impl.hpp
# Opt level: O1

void __thiscall
hiberlite::KillChildren::
act<hiberlite::AVisitor<hiberlite::KillChildren>,std::__cxx11::string,hiberlite::stl_stream_adapter<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (KillChildren *this,AVisitor<hiberlite::KillChildren> *av,
          collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  int *piVar1;
  pointer pcVar2;
  longlong *plVar3;
  pointer plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_value;
  _Elt_pointer plVar5;
  ulong uVar6;
  long lVar7;
  string tab;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> el;
  vector<long_long,_std::allocator<long_long>_> children;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  shared_connection local_1b8;
  shared_connection local_1a8;
  undefined1 local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  _Alloc_hider local_170;
  undefined1 local_168 [24];
  vector<long_long,_std::allocator<long_long>_> local_150;
  string local_138;
  string local_118;
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  char local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = (nvp->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (nvp->name)._M_string_length);
  AVisitor<hiberlite::KillChildren>::diveTable(av,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_198._0_8_ = local_198 + 0x10;
  pcVar2 = (av->scope)._table._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,pcVar2,pcVar2 + (av->scope)._table._M_string_length);
  pcVar2 = (av->scope)._prefix._M_dataplus._M_p;
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar2,pcVar2 + (av->scope)._prefix._M_string_length);
  local_168._16_4_ = (av->scope).prefix_depth;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_198._0_8_,(pointer)(local_198._0_8_ + local_198._8_8_));
  if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168) {
    operator_delete(local_178);
  }
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
  local_1a8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_1a8.res = (av->rootKey).con.res;
  if (local_1a8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1a8.res)->refCount = (local_1a8.res)->refCount + 1;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_1d8,local_1d8 + local_1d0);
  plVar5 = (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar5 == (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    plVar5 = (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Database::dbSelectChildIds(&local_150,&local_1a8,&local_70,plVar5[-1]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_1a8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_1a8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_1a8.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_1a8.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  if (local_150.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_150.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      plVar4 = local_150.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      _value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
      (_value->_M_dataplus)._M_p = (pointer)&_value->field_2;
      _value->_M_string_length = 0;
      (_value->field_2)._M_local_buf[0] = '\0';
      plVar3 = (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (plVar3 == (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl
                    .super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<long_long,std::allocator<long_long>>::_M_push_back_aux<long_long_const&>
                  ((deque<long_long,std::allocator<long_long>> *)this,
                   (longlong *)((long)plVar4 + lVar7));
      }
      else {
        *plVar3 = *(longlong *)((long)plVar4 + lVar7);
        (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = plVar3 + 1;
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"item","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
      sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      sql_nvp((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_198,&local_138,_value,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,local_198._0_8_,(pointer)(local_198._0_8_ + local_198._8_8_));
      local_f8._32_8_ = local_178;
      local_d0._M_p = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_170._M_p,local_170._M_p + local_168._0_8_);
      AVisitor<hiberlite::KillChildren>::operator&
                (av,(sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_f8);
      if (local_d0._M_p != local_c0) {
        operator_delete(local_d0._M_p);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_);
      }
      std::deque<long_long,_std::allocator<long_long>_>::pop_back
                ((deque<long_long,_std::allocator<long_long>_> *)this);
      access::destroy<hiberlite::KillChildren,std::__cxx11::string>(this,_value);
      if (local_170._M_p != local_168 + 8) {
        operator_delete(local_170._M_p);
      }
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_);
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < (ulong)((long)local_150.
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)local_150.
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_start >> 3));
  }
  AVisitor<hiberlite::KillChildren>::popScope(av);
  local_1b8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_1b8.res = (av->rootKey).con.res;
  if (local_1b8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1b8.res)->refCount = (local_1b8.res)->refCount + 1;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_1d8,local_1d8 + local_1d0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"hiberlite_parent_id","");
  plVar5 = (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar5 == (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    plVar5 = (this->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Database::dbDeleteRows<long_long>(&local_1b8,&local_90,&local_b0,plVar5[-1]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_1b8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_1b8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_1b8.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_1b8.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  if (local_150.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  return;
}

Assistant:

void KillChildren::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, rowId.top());
		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));
				rowId.push(children[i]);
					sql_nvp<E> el("item",*entry);
					av & el;
				rowId.pop();
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();

	Database::dbDeleteRows(av.getConnection(),tab,HIBERLITE_PARENTID_COLUMN,rowId.top());
}